

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O2

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  int i;
  long lVar2;
  long in_RDX;
  long lVar3;
  long lVar4;
  int k;
  long lVar5;
  ulong extraout_XMM0_Qa;
  ulong uVar6;
  float fVar7;
  ulong in_XMM1_Qa;
  Matrix2f MVar8;
  
  Matrix2f::Matrix2f(x,0.0);
  uVar6 = extraout_XMM0_Qa;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    lVar3 = in_RDX;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      fVar1 = y->m_elements[lVar4 * 2 + lVar2];
      uVar6 = (ulong)(uint)fVar1;
      for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
        fVar7 = *(float *)(lVar3 + lVar5 * 8) * fVar1 + *(float *)((long)x + lVar5 * 2 * 4);
        in_XMM1_Qa = (ulong)(uint)fVar7;
        *(float *)((long)x + lVar5 * 2 * 4) = fVar7;
      }
      lVar3 = lVar3 + 4;
    }
    x = (Matrix2f *)((long)x + 4);
  }
  MVar8.m_elements[2] = (float)(int)in_XMM1_Qa;
  MVar8.m_elements[3] = (float)(int)(in_XMM1_Qa >> 0x20);
  MVar8.m_elements[0] = (float)(int)uVar6;
  MVar8.m_elements[1] = (float)(int)(uVar6 >> 0x20);
  return (Matrix2f)MVar8.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}